

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cpp
# Opt level: O2

void __thiscall
libcellml::Validator::ValidatorImpl::validateAndCleanMathCiCnNodes
          (ValidatorImpl *this,XmlNodePtr *node,ComponentPtr *component,NameList *variableNames)

{
  bool bVar1;
  XmlNodePtr childNode;
  XmlNodePtr local_48;
  __shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2> local_38;
  
  bVar1 = XmlNode::isMathmlElement
                    ((node->super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr,"cn");
  if (bVar1) {
    validateAndCleanCnNode(this,node,component);
  }
  else {
    bVar1 = XmlNode::isMathmlElement
                      ((node->super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr,"ci");
    if (bVar1) {
      validateAndCleanCiNode(this,node,component,variableNames);
    }
  }
  XmlNode::firstChild((XmlNode *)&local_48);
  if (local_48.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    validateAndCleanMathCiCnNodes(this,&local_48,component,variableNames);
  }
  XmlNode::next((XmlNode *)&local_38);
  std::__shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&node->super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>,&local_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
  if ((node->super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr !=
      (element_type *)0x0) {
    validateAndCleanMathCiCnNodes(this,node,component,variableNames);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_48.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void Validator::ValidatorImpl::validateAndCleanMathCiCnNodes(XmlNodePtr &node, const ComponentPtr &component, const NameList &variableNames)
{
    if (node->isMathmlElement("cn")) {
        validateAndCleanCnNode(node, component);
    } else if (node->isMathmlElement("ci")) {
        validateAndCleanCiNode(node, component, variableNames);
    }
    // Check children for ci/cn.
    XmlNodePtr childNode = node->firstChild();
    if (childNode != nullptr) {
        validateAndCleanMathCiCnNodes(childNode, component, variableNames);
    }
    // Check siblings for ci/cn.
    node = node->next();
    if (node != nullptr) {
        validateAndCleanMathCiCnNodes(node, component, variableNames);
    }
}